

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProcess.cpp
# Opt level: O2

void ac::core::detail::rgba2yuva<float,float>
               (Image *src,Image *dsty,Image *dstu,Image *dstv,Image *dsta)

{
  anon_class_1_0_00000001 local_1;
  
  filter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_TianZerL[P]Anime4KCPP_core_src_ImageProcess_cpp:181:16),_const_ac::core::Image,_ac::core::Image,_ac::core::Image,_ac::core::Image,_ac::core::Image,_true>
            (&local_1,src,dsty,dstu,dstv,dsta);
  return;
}

Assistant:

inline void rgba2yuva(const Image& src, Image& dsty, Image& dstu, Image& dstv, Image& dsta)
    {
        filter([](const int /*i*/, const int /*j*/, const void* const sptr, void* const yptr, void* const uptr, void* const vptr, void* const aptr) {
            auto in = static_cast<const IN*>(sptr);
            auto yout = static_cast<OUT*>(yptr);
            auto uout = static_cast<OUT*>(uptr);
            auto vout = static_cast<OUT*>(vptr);
            auto aout = static_cast<OUT*>(aptr);

            float r = toFloat(in[0]);
            float g = toFloat(in[1]);
            float b = toFloat(in[2]);

            float y = 0.299f * r + 0.587f * g + 0.114f * b;
            float u = 0.564f * (b - y) + 0.5f;
            float v = 0.713f * (r - y) + 0.5f;

            *yout = fromFloat<OUT>(y);
            *uout = fromFloat<OUT>(u);
            *vout = fromFloat<OUT>(v);
            if constexpr (std::is_same_v<IN, OUT>) *aout = in[3];
            else *aout = fromFloat<OUT>(toFloat(in[3]));
        }, src, dsty, dstu, dstv, dsta);
    }